

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

void __thiscall
testing::internal::FunctionMocker<void_(int)>::PerformAction
          (FunctionMocker<void_(int)> *this,void *untyped_action,ArgumentTuple *args,
          string *call_description)

{
  Action<void_(int)> action;
  _Head_base<0UL,_int,_false> local_34;
  _Any_data local_30;
  code *local_20;
  
  if (untyped_action != (void *)0x0) {
    std::function<void_(int)>::function
              ((function<void_(int)> *)&local_30,(function<void_(int)> *)untyped_action);
    local_34._M_head_impl =
         (args->super__Tuple_impl<0UL,_int>).super__Head_base<0UL,_int,_false>._M_head_impl;
    Action<void_(int)>::Perform((Action<void_(int)> *)&local_30,(ArgumentTuple *)&local_34);
    if (local_20 != (code *)0x0) {
      (*local_20)(&local_30,&local_30,__destroy_functor);
    }
    return;
  }
  PerformDefaultAction(this,args,call_description);
  return;
}

Assistant:

R PerformAction(const void* untyped_action, ArgumentTuple&& args,
                  const std::string& call_description) const {
    if (untyped_action == nullptr) {
      return PerformDefaultAction(std::move(args), call_description);
    }

    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    return action.Perform(std::move(args));
  }